

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int init_blocksize(vorb *f,int b,int n)

{
  int iVar1;
  float *pfVar2;
  uint16 *puVar3;
  int n8;
  int n4;
  int n2;
  int n_local;
  int b_local;
  vorb *f_local;
  
  iVar1 = n >> 1;
  pfVar2 = (float *)setup_malloc(f,iVar1 << 2);
  f->A[b] = pfVar2;
  pfVar2 = (float *)setup_malloc(f,iVar1 << 2);
  f->B[b] = pfVar2;
  pfVar2 = (float *)setup_malloc(f,(n >> 2) << 2);
  f->C[b] = pfVar2;
  if (((f->A[b] == (float *)0x0) || (f->B[b] == (float *)0x0)) || (f->C[b] == (float *)0x0)) {
    f_local._4_4_ = error(f,VORBIS_outofmem);
  }
  else {
    compute_twiddle_factors(n,f->A[b],f->B[b],f->C[b]);
    pfVar2 = (float *)setup_malloc(f,iVar1 << 2);
    f->window[b] = pfVar2;
    if (f->window[b] == (float *)0x0) {
      f_local._4_4_ = error(f,VORBIS_outofmem);
    }
    else {
      compute_window(n,f->window[b]);
      puVar3 = (uint16 *)setup_malloc(f,(n >> 3) << 1);
      f->bit_reverse[b] = puVar3;
      if (f->bit_reverse[b] == (uint16 *)0x0) {
        f_local._4_4_ = error(f,VORBIS_outofmem);
      }
      else {
        compute_bitreverse(n,f->bit_reverse[b]);
        f_local._4_4_ = 1;
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

static int init_blocksize(vorb *f, int b, int n)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3;
   f->A[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->B[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->C[b] = (float *) setup_malloc(f, sizeof(float) * n4);
   if (!f->A[b] || !f->B[b] || !f->C[b]) return error(f, VORBIS_outofmem);
   compute_twiddle_factors(n, f->A[b], f->B[b], f->C[b]);
   f->window[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   if (!f->window[b]) return error(f, VORBIS_outofmem);
   compute_window(n, f->window[b]);
   f->bit_reverse[b] = (uint16 *) setup_malloc(f, sizeof(uint16) * n8);
   if (!f->bit_reverse[b]) return error(f, VORBIS_outofmem);
   compute_bitreverse(n, f->bit_reverse[b]);
   return TRUE;
}